

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim.c
# Opt level: O2

void Gia_ManIncrSimCone_rec(Gia_Man_t *p,int iObj)

{
  int iVar1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  
  pGVar3 = Gia_ManObj(p,iObj);
  if ((~*(uint *)pGVar3 & 0x9fffffff) != 0) {
    iVar1 = Vec_IntEntry(p->vTimeStamps,iObj);
    if (iVar1 != p->iTimeStamp) {
      iVar1 = Vec_IntEntry(p->vTimeStamps,iObj);
      if (p->iTimeStamp <= iVar1) {
        __assert_fail("Vec_IntEntry(p->vTimeStamps, iObj) < p->iTimeStamp",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSim.c"
                      ,0x4ae,"void Gia_ManIncrSimCone_rec(Gia_Man_t *, int)");
      }
      Vec_IntWriteEntry(p->vTimeStamps,iObj,p->iTimeStamp);
      uVar2 = (uint)*(undefined8 *)pGVar3;
      if ((-1 < (int)uVar2) && ((uVar2 & 0x1fffffff) != 0x1fffffff)) {
        Gia_ManIncrSimCone_rec(p,iObj - (uVar2 & 0x1fffffff));
        Gia_ManIncrSimCone_rec(p,iObj - (*(uint *)&pGVar3->field_0x4 & 0x1fffffff));
        Gia_ManBuiltInSimPerformInt(p,iObj);
        return;
      }
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSim.c"
                    ,0x4b0,"void Gia_ManIncrSimCone_rec(Gia_Man_t *, int)");
    }
  }
  return;
}

Assistant:

void Gia_ManIncrSimCone_rec( Gia_Man_t * p, int iObj )
{
    Gia_Obj_t * pObj = Gia_ManObj( p, iObj );
    if ( Gia_ObjIsCi(pObj) )
        return;
    if ( Vec_IntEntry(p->vTimeStamps, iObj) == p->iTimeStamp )
        return;
    assert( Vec_IntEntry(p->vTimeStamps, iObj) < p->iTimeStamp );
    Vec_IntWriteEntry( p->vTimeStamps, iObj, p->iTimeStamp );
    assert( Gia_ObjIsAnd(pObj) );
    Gia_ManIncrSimCone_rec( p, Gia_ObjFaninId0(pObj, iObj) );
    Gia_ManIncrSimCone_rec( p, Gia_ObjFaninId1(pObj, iObj) );
    Gia_ManBuiltInSimPerformInt( p, iObj );
}